

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

void anon_unknown.dwarf_47aea5::CheckInferDescriptor
               (string *script_hex,string *expected_desc,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *hex_scripts,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *origin_pubkeys)

{
  Span<const_unsigned_char> _vch;
  string_view str;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  string_view separators;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  size_t sVar4;
  pointer pDVar5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_>,_bool> pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_bool> pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_bool>
  pVar8;
  char last;
  bool hardened;
  size_t i;
  type *origin_str;
  type *pubkey_hex;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  CScript *prov_script;
  string *prov_script_hex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  CScript *script;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc;
  uint32_t p;
  Span<const_char> elem;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fpr_bytes;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> origin_split;
  Span<const_char> origin_sp;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prov_script_bytes;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_bytes;
  KeyOriginInfo info;
  string checksum;
  string fpr_str;
  CPubKey origin_pubkey;
  FlatSigningProvider provider;
  char *in_stack_fffffffffffff978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff990;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff998;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff9a0;
  const_string *msg;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  _Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
  in_stack_fffffffffffff9b0;
  unit_test_log_t *in_stack_fffffffffffff9b8;
  char *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  allocator<char> *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffff9e8;
  byte local_581;
  char *local_580;
  undefined1 local_498 [16];
  undefined1 local_488 [76];
  uint local_43c;
  allocator<char> local_435;
  uint local_434;
  Span<const_char> local_430;
  char *local_420;
  size_t local_418;
  allocator<char> local_3f1 [97];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_390;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  _Base_ptr local_340;
  undefined1 local_338;
  _Base_ptr local_310;
  undefined1 local_308;
  _Base_ptr local_300;
  undefined1 local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [504];
  unit_test_log_t local_b8 [22];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff998._M_current);
  hex_str._M_str = in_stack_fffffffffffff9e8;
  hex_str._M_len = (size_t)in_stack_fffffffffffff9e0;
  ParseHex<unsigned_char>(hex_str);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980);
  CScript::
  CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((CScript *)in_stack_fffffffffffff978,in_stack_fffffffffffff998,
             in_stack_fffffffffffff990);
  FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_fffffffffffff978);
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff980);
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff980);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff988,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff980), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff978);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998._M_current);
    hex_str_00._M_str = in_stack_fffffffffffff9e8;
    hex_str_00._M_len = (size_t)in_stack_fffffffffffff9e0;
    ParseHex<unsigned_char>(hex_str_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980);
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff978,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    CScriptID::CScriptID
              ((CScriptID *)in_stack_fffffffffffff990._M_current,
               (CScript *)in_stack_fffffffffffff988);
    pVar6 = std::
            map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
            ::emplace<CScriptID,CScript_const&>
                      ((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                        *)in_stack_fffffffffffff998._M_current,
                       (CScriptID *)in_stack_fffffffffffff990._M_current,
                       (CScript *)in_stack_fffffffffffff988);
    local_300 = (_Base_ptr)pVar6.first._M_node;
    local_2f8 = pVar6.second;
    CScript::~CScript((CScript *)in_stack_fffffffffffff978);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff988);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff978);
  }
  local_388 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff980);
  local_390 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff980);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff988,
                       (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff980);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      GetDescriptorChecksum((string *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8))
      ;
      InferDescriptor((CScript *)in_stack_fffffffffffff998._M_current,
                      (SigningProvider *)in_stack_fffffffffffff990._M_current);
      do {
        msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
                   (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff978);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff9b8,(const_string *)in_stack_fffffffffffff9b0._M_node,
                   CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),msg);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff980,(char (*) [1])in_stack_fffffffffffff978
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
                   (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
        pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                           ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                            in_stack_fffffffffffff978);
        (*pDVar5->_vptr_Descriptor[4])(local_2b0,pDVar5,0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9b0._M_node,
                       (char *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff990._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff988);
        in_stack_fffffffffffff988 = "expected_desc + \"#\" + checksum";
        in_stack_fffffffffffff980 = &local_2d0;
        in_stack_fffffffffffff978 = "desc->ToString()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_488,local_498,0x1de,1,2,local_2b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff978);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff978);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff978);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff978);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
                ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                 in_stack_fffffffffffff988);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff978);
      FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_fffffffffffff978);
      CScript::~CScript((CScript *)in_stack_fffffffffffff978);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff988)
      ;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator*((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_fffffffffffff978);
    std::get<0ul,std::__cxx11::string,std::__cxx11::string>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff978);
    std::get<1ul,std::__cxx11::string,std::__cxx11::string>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff978);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998._M_current);
    hex_str_01._M_str = in_stack_fffffffffffff9e8;
    hex_str_01._M_len = (size_t)in_stack_fffffffffffff9e0;
    ParseHex<unsigned_char>(hex_str_01);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff988,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980,
               in_stack_fffffffffffff978);
    _vch.m_size = (size_t)in_stack_fffffffffffff998._M_current;
    _vch.m_data = in_stack_fffffffffffff990._M_current;
    CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffff988,_vch);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff988);
    CPubKey::GetID((CPubKey *)in_stack_fffffffffffff9a0._M_current);
    pVar7 = std::
            map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>::
            emplace<CKeyID,CPubKey&>
                      ((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                        *)in_stack_fffffffffffff998._M_current,
                       (CKeyID *)in_stack_fffffffffffff990._M_current,
                       (CPubKey *)in_stack_fffffffffffff988);
    local_310 = (_Base_ptr)pVar7.first._M_node;
    local_308 = pVar7.second;
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff978);
    if (!bVar1) {
      KeyOriginInfo::KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffff978);
      Span<char_const>::Span<std::__cxx11::string>
                ((Span<const_char> *)in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                 in_stack_fffffffffffff978);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffff998._M_current,(char *)in_stack_fffffffffffff990._M_current);
      separators._M_str = in_stack_fffffffffffff9d8;
      separators._M_len = (size_t)in_stack_fffffffffffff9d0;
      util::Split<Span<char_const>>
                ((Span<const_char> *)in_stack_fffffffffffff9b0._M_node,separators);
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 in_stack_fffffffffffff988,(size_type)in_stack_fffffffffffff980);
      Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffff978);
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 in_stack_fffffffffffff988,(size_type)in_stack_fffffffffffff980);
      Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffff978);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),
                 (char *)in_stack_fffffffffffff9a0._M_current,
                 (char *)in_stack_fffffffffffff998._M_current,
                 (allocator<char> *)in_stack_fffffffffffff990._M_current);
      std::allocator<char>::~allocator(local_3f1);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff998._M_current);
      hex_str_02._M_str = in_stack_fffffffffffff9e8;
      hex_str_02._M_len = (size_t)in_stack_fffffffffffff9e0;
      ParseHex<unsigned_char>(hex_str_02);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980)
      ;
      __first._M_current._7_1_ = in_stack_fffffffffffff9af;
      __first._M_current._0_7_ = in_stack_fffffffffffff9a8;
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                (__first,in_stack_fffffffffffff9a0,(uchar *)in_stack_fffffffffffff988);
      local_580 = (char *)0x1;
      while (in_stack_fffffffffffff9e8 = local_580,
            pcVar2 = (char *)std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                                       ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                         *)in_stack_fffffffffffff978),
            in_stack_fffffffffffff9e8 < pcVar2) {
        pvVar3 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                           ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                            in_stack_fffffffffffff988,(size_type)in_stack_fffffffffffff980);
        local_420 = pvVar3->m_data;
        local_418 = pvVar3->m_size;
        local_581 = 0;
        sVar4 = Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffff978);
        if (sVar4 != 0) {
          Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffff978);
          pcVar2 = Span<const_char>::operator[]
                             ((Span<const_char> *)in_stack_fffffffffffff988,
                              (size_t)in_stack_fffffffffffff980);
          if ((*pcVar2 == '\'') || (*pcVar2 == 'h')) {
            Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffff978);
            local_430 = Span<const_char>::first
                                  ((Span<const_char> *)in_stack_fffffffffffff988,
                                   (size_t)in_stack_fffffffffffff980);
            local_420 = local_430.m_data;
            local_418 = local_430.m_size;
            local_581 = 1;
          }
        }
        in_stack_fffffffffffff9d0 =
             Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffff978);
        in_stack_fffffffffffff9d8 =
             Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffff978);
        in_stack_fffffffffffff9e0 = &local_435;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),
                   (char *)in_stack_fffffffffffff9a0._M_current,
                   (char *)in_stack_fffffffffffff998._M_current,
                   (allocator<char> *)in_stack_fffffffffffff990._M_current);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff998._M_current);
        str._M_str = (char *)in_stack_fffffffffffff998._M_current;
        str._M_len = (size_t)in_stack_fffffffffffff990._M_current;
        bVar1 = ParseUInt32(str,(uint32_t *)in_stack_fffffffffffff978);
        if (!bVar1) {
          __assert_fail("ParseUInt32(std::string(elem.begin(), elem.end()), &p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                        ,0x1d3,
                        "void (anonymous namespace)::CheckInferDescriptor(const std::string &, const std::string &, const std::vector<std::string> &, const std::vector<std::pair<std::string, std::string>> &)"
                       );
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff978);
        std::allocator<char>::~allocator(&local_435);
        local_43c = local_434 | (uint)local_581 << 0x1f;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff978,
                   (value_type_conflict5 *)0x622227);
        local_580 = local_580 + 1;
      }
      in_stack_fffffffffffff9b8 = local_b8;
      CPubKey::GetID((CPubKey *)in_stack_fffffffffffff9a0._M_current);
      std::make_pair<CPubKey&,KeyOriginInfo&>
                ((CPubKey *)in_stack_fffffffffffff980,(KeyOriginInfo *)in_stack_fffffffffffff978);
      pVar8 = std::
              map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
              ::emplace<CKeyID,std::pair<CPubKey,KeyOriginInfo>>
                        ((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                          *)in_stack_fffffffffffff998._M_current,
                         (CKeyID *)in_stack_fffffffffffff990._M_current,
                         (pair<CPubKey,_KeyOriginInfo> *)in_stack_fffffffffffff988);
      in_stack_fffffffffffff9b0 = pVar8.first._M_node;
      in_stack_fffffffffffff9af = pVar8.second;
      local_340 = in_stack_fffffffffffff9b0._M_node;
      local_338 = in_stack_fffffffffffff9af;
      std::pair<CPubKey,_KeyOriginInfo>::~pair
                ((pair<CPubKey,_KeyOriginInfo> *)in_stack_fffffffffffff978);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff988)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff978);
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::~vector
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 in_stack_fffffffffffff988);
      KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffff978);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff978);
  } while( true );
}

Assistant:

void CheckInferDescriptor(const std::string& script_hex, const std::string& expected_desc, const std::vector<std::string>& hex_scripts, const std::vector<std::pair<std::string, std::string>>& origin_pubkeys)
{
    std::vector<unsigned char> script_bytes{ParseHex(script_hex)};
    const CScript& script{script_bytes.begin(), script_bytes.end()};

    FlatSigningProvider provider;
    for (const std::string& prov_script_hex : hex_scripts) {
        std::vector<unsigned char> prov_script_bytes{ParseHex(prov_script_hex)};
        const CScript& prov_script{prov_script_bytes.begin(), prov_script_bytes.end()};
        provider.scripts.emplace(CScriptID(prov_script), prov_script);
    }
    for (const auto& [pubkey_hex, origin_str] : origin_pubkeys) {
        CPubKey origin_pubkey{ParseHex(pubkey_hex)};
        provider.pubkeys.emplace(origin_pubkey.GetID(), origin_pubkey);

        if (!origin_str.empty()) {
            KeyOriginInfo info;
            Span<const char> origin_sp{origin_str};
            std::vector<Span<const char>> origin_split = Split(origin_sp, "/");
            std::string fpr_str(origin_split[0].begin(), origin_split[0].end());
            auto fpr_bytes = ParseHex(fpr_str);
            std::copy(fpr_bytes.begin(), fpr_bytes.end(), info.fingerprint);
            for (size_t i = 1; i < origin_split.size(); ++i) {
                Span<const char> elem = origin_split[i];
                bool hardened = false;
                if (elem.size() > 0) {
                    const char last = elem[elem.size() - 1];
                    if (last == '\'' || last == 'h') {
                        elem = elem.first(elem.size() - 1);
                        hardened = true;
                    }
                }
                uint32_t p;
                assert(ParseUInt32(std::string(elem.begin(), elem.end()), &p));
                info.path.push_back(p | (((uint32_t)hardened) << 31));
            }

            provider.origins.emplace(origin_pubkey.GetID(), std::make_pair(origin_pubkey, info));
        }
    }

    std::string checksum{GetDescriptorChecksum(expected_desc)};

    std::unique_ptr<Descriptor> desc = InferDescriptor(script, provider);
    BOOST_CHECK_EQUAL(desc->ToString(), expected_desc + "#" + checksum);
}